

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

GCcdata * lj_cdata_newv(lua_State *L,CTypeID id,CTSize sz,CTSize align)

{
  uint64_t uVar1;
  void *pvVar2;
  ulong uVar3;
  GCcdata *pGVar4;
  int local_54;
  GCcdata *cd;
  uintptr_t almask;
  uintptr_t adata;
  char *p;
  MSize extra;
  global_State *g;
  CTSize align_local;
  CTSize sz_local;
  CTypeID id_local;
  lua_State *L_local;
  
  if (align < 4) {
    local_54 = 0;
  }
  else {
    local_54 = (1 << ((byte)align & 0x1f)) + -8;
  }
  pvVar2 = lj_mem_realloc(L,(void *)0x0,0,(ulong)(local_54 + 0x18 + sz));
  uVar3 = (ulong)((1 << ((byte)align & 0x1f)) - 1);
  uVar3 = (long)pvVar2 + uVar3 + 0x18 & (uVar3 ^ 0xffffffffffffffff);
  pGVar4 = (GCcdata *)(uVar3 - 0x10);
  *(short *)(uVar3 - 0x18) = (short)pGVar4 - (short)pvVar2;
  *(short *)(uVar3 - 0x16) = (short)(local_54 + 0x18);
  *(CTSize *)(uVar3 - 0x14) = sz;
  uVar1 = (L->glref).ptr64;
  (pGVar4->nextgc).gcptr64 = *(uint64_t *)(uVar1 + 0x28);
  *(GCcdata **)(uVar1 + 0x28) = pGVar4;
  *(byte *)(uVar3 - 8) = *(byte *)(uVar1 + 0x20) & 3;
  *(byte *)(uVar3 - 8) = *(byte *)(uVar3 - 8) | 0x80;
  *(undefined1 *)(uVar3 - 7) = 10;
  *(short *)(uVar3 - 6) = (short)id;
  return pGVar4;
}

Assistant:

GCcdata *lj_cdata_newv(lua_State *L, CTypeID id, CTSize sz, CTSize align)
{
  global_State *g;
  MSize extra = sizeof(GCcdataVar) + sizeof(GCcdata) +
		(align > CT_MEMALIGN ? (1u<<align) - (1u<<CT_MEMALIGN) : 0);
  char *p = lj_mem_newt(L, extra + sz, char);
  uintptr_t adata = (uintptr_t)p + sizeof(GCcdataVar) + sizeof(GCcdata);
  uintptr_t almask = (1u << align) - 1u;
  GCcdata *cd = (GCcdata *)(((adata + almask) & ~almask) - sizeof(GCcdata));
  lj_assertL((char *)cd - p < 65536, "excessive cdata alignment");
  cdatav(cd)->offset = (uint16_t)((char *)cd - p);
  cdatav(cd)->extra = extra;
  cdatav(cd)->len = sz;
  g = G(L);
  setgcrefr(cd->nextgc, g->gc.root);
  setgcref(g->gc.root, obj2gco(cd));
  newwhite(g, obj2gco(cd));
  cd->marked |= 0x80;
  cd->gct = ~LJ_TCDATA;
  cd->ctypeid = id;
  return cd;
}